

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipm.cc
# Opt level: O0

void __thiscall ipx::IPM::StartingPoint(IPM *this,KKTSolver *kkt,Iterate *iterate,Info *info)

{
  long in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  IPM *in_stack_00000480;
  IPM *in_stack_00000490;
  IPM *in_stack_000005b0;
  
  *(undefined8 *)(in_RDI + 8) = in_RSI;
  *(undefined8 *)(in_RDI + 0x10) = in_RDX;
  *(long *)(in_RDI + 0x18) = in_RCX;
  PrintHeader(in_stack_00000480);
  ComputeStartingPoint(in_stack_00000490);
  if (*(int *)(in_RCX + 0xc) == 0) {
    PrintOutput(in_stack_000005b0);
  }
  if (*(int *)(in_RCX + 0xc) == 0x3e6) {
    *(undefined4 *)(in_RCX + 0xc) = 0;
    *(undefined4 *)(in_RCX + 4) = 5;
  }
  else if (*(int *)(in_RCX + 0xc) == 999) {
    *(undefined4 *)(in_RCX + 0xc) = 0;
    *(undefined4 *)(in_RCX + 4) = 6;
  }
  else if (*(int *)(in_RCX + 0xc) == 0) {
    *(undefined4 *)(in_RCX + 4) = 0;
  }
  else {
    *(undefined4 *)(in_RCX + 4) = 9;
  }
  return;
}

Assistant:

void IPM::StartingPoint(KKTSolver* kkt, Iterate* iterate, Info* info) {
    kkt_ = kkt;
    iterate_ = iterate;
    info_ = info;
    PrintHeader();
    ComputeStartingPoint();
    if (info->errflag == 0)
        PrintOutput();
    // Set status_ipm.
    if (info->errflag == IPX_ERROR_user_interrupt) {
        info->errflag = 0;
        info->status_ipm = IPX_STATUS_user_interrupt;
    } else if (info->errflag == IPX_ERROR_time_interrupt) {
        info->errflag = 0;
        info->status_ipm = IPX_STATUS_time_limit;
    } else if (info->errflag) {
        info->status_ipm = IPX_STATUS_failed;
    } else {
        info->status_ipm = IPX_STATUS_not_run;
    }
}